

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwMaximizeWindow(GLFWwindow *handle)

{
  long lVar1;
  uchar *puVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  _GLFWwindow *window;
  ulong uVar7;
  long in_stack_ffffffffffffffc8;
  uchar *puStack_28;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jeertmans[P]DelaunayTriangulation/deps/BOV/deps/glfw/src/window.c"
                  ,0x2f0,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x48) != 0) {
      return;
    }
    if (((_glfw.x11.NET_WM_STATE != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0)) &&
       (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
      iVar3 = _glfwPlatformWindowVisible((_GLFWwindow *)handle);
      if (iVar3 == 0) {
        puStack_28 = (uchar *)0x0;
        uVar4 = _glfwGetWindowPropertyX11
                          (*(Window *)(handle + 0x350),_glfw.x11.NET_WM_STATE,4,&puStack_28);
        puVar2 = puStack_28;
        uVar7 = 2;
        for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
            if (*(long *)(puVar2 + uVar5 * 8) == *(long *)(&stack0xffffffffffffffc8 + uVar6 * 8)) {
              lVar1 = uVar7 * 8;
              uVar7 = uVar7 - 1;
              *(undefined8 *)(&stack0xffffffffffffffc8 + uVar6 * 8) =
                   *(undefined8 *)(&stack0xffffffffffffffc0 + lVar1);
            }
          }
        }
        if (puVar2 != (uchar *)0x0) {
          (*_glfw.x11.xlib.Free)(puVar2);
        }
        if (uVar7 == 0) {
          return;
        }
        (*_glfw.x11.xlib.ChangeProperty)
                  (_glfw.x11.display,*(Window *)(handle + 0x350),_glfw.x11.NET_WM_STATE,4,0x20,2,
                   &stack0xffffffffffffffc8,(int)uVar7);
      }
      else {
        sendEventToWM((_GLFWwindow *)handle,_glfw.x11.NET_WM_STATE,1,
                      _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT,_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ,1,
                      in_stack_ffffffffffffffc8);
      }
      (*_glfw.x11.xlib.Flush)(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}